

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SleepCommand.h
# Opt level: O2

void __thiscall SleepCommand::~SleepCommand(SleepCommand *this)

{
  (this->super_Command)._vptr_Command = (_func_int **)&PTR_execute_001148c8;
  std::__cxx11::string::~string((string *)&this->time_to_sleep_string);
  return;
}

Assistant:

~SleepCommand() override = default;